

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Error(sqlite3 *db,int err_code)

{
  int err_code_local;
  sqlite3 *db_local;
  
  db->errCode = err_code;
  if ((err_code == 0) && (db->pErr == (sqlite3_value *)0x0)) {
    db->errByteOffset = -1;
  }
  else {
    sqlite3ErrorFinish(db,err_code);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Error(sqlite3 *db, int err_code){
  assert( db!=0 );
  db->errCode = err_code;
  if( err_code || db->pErr ){
    sqlite3ErrorFinish(db, err_code);
  }else{
    db->errByteOffset = -1;
  }
}